

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Articulated_Parts_PDU.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::PDU::Articulated_Parts_PDU::operator==
          (Articulated_Parts_PDU *this,Articulated_Parts_PDU *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = LE_Header::operator!=(&this->super_LE_Header,&Value->super_LE_Header);
  if ((KVar1) || (this->m_ui8NumOfVariableParams != Value->m_ui8NumOfVariableParams)) {
    bVar2 = false;
  }
  else {
    bVar2 = std::operator!=(&this->m_vVariableParameters,&Value->m_vVariableParameters);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

KBOOL Articulated_Parts_PDU::operator == ( const Articulated_Parts_PDU & Value ) const
{
    if( LE_Header::operator      != ( Value ) )                     return false;
    if( m_ui8NumOfVariableParams != Value.m_ui8NumOfVariableParams )return false;
    if( m_vVariableParameters    != Value.m_vVariableParameters )   return false;
    return true;
}